

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t archive_string_append_unicode
                  (archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  uint uVar2;
  size_t sVar3;
  void *pvVar4;
  archive_string *paVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  code *pcVar9;
  uint uVar10;
  undefined8 unaff_R12;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  code *pcVar14;
  wchar_t local_70;
  uint32_t uc;
  size_t local_68;
  void *local_60;
  ulong local_58;
  code *local_50;
  long local_48;
  long local_40;
  code *local_38;
  
  wVar1 = sc->flag;
  pcVar14 = unicode_to_utf16be;
  lVar7 = 2;
  uVar11 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  if (((uint)wVar1 >> 10 & 1) == 0) {
    if (((uint)wVar1 >> 0xc & 1) == 0) {
      if (((uint)wVar1 >> 8 & 1) == 0) {
        if (((uint)wVar1 >> 0xb & 1) == 0) {
          uVar10 = (uint)wVar1 >> 0xd & 1;
          uVar11 = (ulong)uVar10;
          lVar7 = uVar11 + 1;
          pcVar14 = unicode_to_utf8;
          if (uVar10 != 0) {
            pcVar14 = unicode_to_utf16le;
          }
        }
      }
      else {
        pcVar14 = unicode_to_utf8;
        uVar11 = 0;
        lVar7 = 1;
      }
    }
    else {
      pcVar14 = unicode_to_utf16le;
    }
  }
  pcVar9 = utf16le_to_unicode;
  if (((uint)wVar1 >> 0xd & 1) == 0) {
    pcVar9 = cesu8_to_unicode;
  }
  lVar8 = 1;
  if ((wVar1 & 0x2800U) == 0) {
    lVar8 = lVar7;
  }
  local_38 = utf16be_to_unicode;
  if (((uint)wVar1 >> 0xb & 1) == 0) {
    local_38 = pcVar9;
  }
  local_68 = len;
  paVar5 = archive_string_ensure(as,lVar8 * len + lVar7 + as->length);
  if (paVar5 == (archive_string *)0x0) {
LAB_00330031:
    local_70 = L'\xffffffff';
  }
  else {
    pcVar12 = as->s + as->length;
    pcVar13 = as->s + (as->buffer_length - lVar7);
    local_70 = L'\0';
    local_60 = _p;
    local_58 = uVar11;
    local_50 = pcVar14;
    local_48 = lVar7;
    local_40 = lVar8;
    while (pvVar4 = local_60, sVar3 = local_68, uVar10 = (*local_38)(&uc,local_60,local_68),
          pcVar14 = local_50, uVar10 != 0) {
      uVar2 = -uVar10;
      if (0 < (int)uVar10) {
        uVar2 = uVar10;
      }
      if ((int)uVar10 < 0) {
        local_70 = L'\xffffffff';
      }
      local_60 = (void *)((long)pvVar4 + (ulong)uVar2);
      local_68 = sVar3 - uVar2;
      lVar8 = local_68 * local_40 + local_48;
      while (lVar6 = (*pcVar14)(pcVar12,(long)pcVar13 - (long)pcVar12,uc), lVar6 == 0) {
        as->length = (long)pcVar12 - (long)as->s;
        paVar5 = archive_string_ensure(as,as->buffer_length + lVar8);
        if (paVar5 == (archive_string *)0x0) goto LAB_00330031;
        pcVar12 = as->s + as->length;
        pcVar13 = as->s + (as->buffer_length - lVar7);
      }
      pcVar12 = pcVar12 + lVar6;
    }
    as->length = (long)pcVar12 - (long)as->s;
    *pcVar12 = '\0';
    if ((char)local_58 != '\0') {
      as->s[as->length + 1] = '\0';
    }
  }
  return local_70;
}

Assistant:

static int
archive_string_append_unicode(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s;
	char *p, *endp;
	uint32_t uc;
	size_t w;
	int n, ret = 0, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		ts = 1;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
			ts = 1;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		if (n < 0) {
			/* Use a replaced unicode character. */
			n *= -1;
			ret = -1;
		}
		s += n;
		len -= n;
		while ((w = unparse(p, endp - p, uc)) == 0) {
			/* There is not enough output buffer so
			 * we have to expand it. */
			as->length = p - as->s;
			if (archive_string_ensure(as,
			    as->buffer_length + len * tm + ts) == NULL)
				return (-1);
			p = as->s + as->length;
			endp = as->s + as->buffer_length - ts;
		}
		p += w;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}